

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::read_content
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  bool bVar1;
  const_iterator cVar2;
  long lVar3;
  char *pcVar4;
  key_type local_d8;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  long *local_50 [2];
  long local_40 [2];
  iterator cur;
  
  local_b8._M_unused._M_object = &cur;
  cur._M_node = (_Base_ptr)0x0;
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3100:7)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3100:7)>
             ::_M_manager;
  pcStack_80 = std::
               _Function_handler<bool_(const_httplib::MultipartFormData_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3106:7)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<bool_(const_httplib::MultipartFormData_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3106:7)>
             ::_M_manager;
  local_b8._8_8_ = 0;
  pcStack_a0 = std::
               _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3110:7)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3110:7)>
             ::_M_manager;
  local_98._M_unused._M_object = local_b8._M_unused._M_object;
  local_98._8_8_ = req;
  local_78._M_unused._M_object = req;
  bVar1 = read_content_core(this,strm,last_connection,req,res,(ContentReceiver *)&local_78,
                            (MultipartContentHeader *)&local_98,(ContentReceiver *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Content-Type","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(req->headers)._M_t,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar2._M_node == &(req->headers)._M_t._M_impl.super__Rb_tree_header) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)(cVar2._M_node + 2);
  }
  std::__cxx11::string::string((string *)local_50,pcVar4,(allocator *)&local_d8);
  lVar3 = std::__cxx11::string::find((char *)local_50,0x138ad6,0);
  if (lVar3 == 0) {
    pcVar4 = (req->body)._M_dataplus._M_p;
    detail::
    split<httplib::detail::parse_query_text(std::__cxx11::string_const&,std::multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(char_const*,char_const*)_1_>
              (pcVar4,pcVar4 + (req->body)._M_string_length,'&',
               (anon_class_8_1_65ceeac4)&req->params);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return bVar1;
}

Assistant:

inline bool Server::read_content(Stream &strm, bool last_connection,
                                 Request &req, Response &res) {
  MultipartFormDataMap::iterator cur;
  auto ret = read_content_core(
      strm, last_connection, req, res,
      // Regular
      [&](const char *buf, size_t n) {
        if (req.body.size() + n > req.body.max_size()) { return false; }
        req.body.append(buf, n);
        return true;
      },
      // Multipart
      [&](const MultipartFormData &file) {
        cur = req.files.emplace(file.name, file);
        return true;
      },
      [&](const char *buf, size_t n) {
        auto &content = cur->second.content;
        if (content.size() + n > content.max_size()) { return false; }
        content.append(buf, n);
        return true;
      });

  const auto &content_type = req.get_header_value("Content-Type");
  if (!content_type.find("application/x-www-form-urlencoded")) {
    detail::parse_query_text(req.body, req.params);
  }

  return ret;
}